

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  bool bVar1;
  uint uVar2;
  TestCaseInfo *other;
  IStreamingReporter *pIVar3;
  TestCaseTracker *this_00;
  IContext *pIVar4;
  byte local_352;
  byte local_342;
  TestCaseStats local_328;
  TestCaseTracker local_1d8;
  undefined1 local_158 [8];
  TestCaseInfo testInfo;
  string redirectedCerr;
  string local_58 [8];
  string redirectedCout;
  undefined1 auStack_38 [8];
  Totals prevTotals;
  TestCase *testCase_local;
  RunContext *this_local;
  
  auStack_38 = (undefined1  [8])(this->m_totals).assertions.passed;
  prevTotals.assertions.passed = (this->m_totals).assertions.failed;
  prevTotals.assertions.failed = (this->m_totals).testCases.passed;
  prevTotals.testCases.passed = (this->m_totals).testCases.failed;
  prevTotals.testCases.failed = (size_t)testCase;
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::string((string *)&testInfo.isHidden);
  other = TestCase::getTestCaseInfo((TestCase *)prevTotals.testCases.failed);
  TestCaseInfo::TestCaseInfo((TestCaseInfo *)local_158,other);
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar3,local_158);
  this->m_activeTestCase = (TestCase *)prevTotals.testCases.failed;
  SectionTracking::TestCaseTracker::TestCaseTracker(&local_1d8,(string *)local_158);
  Option<Catch::SectionTracking::TestCaseTracker>::operator=(&this->m_testCaseTracker,&local_1d8);
  SectionTracking::TestCaseTracker::~TestCaseTracker(&local_1d8);
  do {
    do {
      runCurrentTest(this,(string *)local_58,(string *)&testInfo.isHidden);
      this_00 = Option<Catch::SectionTracking::TestCaseTracker>::operator->
                          (&this->m_testCaseTracker);
      bVar1 = SectionTracking::TestCaseTracker::isCompleted(this_00);
      local_342 = 0;
      if (!bVar1) {
        bVar1 = aborting(this);
        local_342 = bVar1 ^ 0xff;
      }
    } while ((local_342 & 1) != 0);
    pIVar4 = getCurrentContext();
    uVar2 = (*pIVar4->_vptr_IContext[5])();
    local_352 = 0;
    if ((uVar2 & 1) != 0) {
      bVar1 = aborting(this);
      local_352 = bVar1 ^ 0xff;
    }
  } while ((local_352 & 1) != 0);
  Totals::delta(__return_storage_ptr__,&this->m_totals,(Totals *)auStack_38);
  Counts::operator+=(&(this->m_totals).testCases,&__return_storage_ptr__->testCases);
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  bVar1 = aborting(this);
  TestCaseStats::TestCaseStats
            (&local_328,(TestCaseInfo *)local_158,__return_storage_ptr__,(string *)local_58,
             (string *)&testInfo.isHidden,bVar1);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar3,&local_328);
  TestCaseStats::~TestCaseStats(&local_328);
  this->m_activeTestCase = (TestCase *)0x0;
  Option<Catch::SectionTracking::TestCaseTracker>::reset(&this->m_testCaseTracker);
  TestCaseInfo::~TestCaseInfo((TestCaseInfo *)local_158);
  std::__cxx11::string::~string((string *)&testInfo.isHidden);
  std::__cxx11::string::~string(local_58);
  return __return_storage_ptr__;
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_activeTestCase = &testCase;
            m_testCaseTracker = TestCaseTracker( testInfo.name );

            do {
                do {
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( !m_testCaseTracker->isCompleted() && !aborting() );
            }
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        aborting() ) );

            m_activeTestCase = NULL;
            m_testCaseTracker.reset();

            return deltaTotals;
        }